

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_compression.cpp
# Opt level: O0

void transpose_uint32_aos_to_soa(char *filename)

{
  int val;
  uint local_5c;
  uint32_t *puStack_58;
  uint32_t i;
  uint32_t *triangles_from_b1b2b3b4;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  uint32_t *triangles;
  float *pfStack_20;
  uint32_t nr_of_triangles;
  float *vertices;
  char *pcStack_10;
  uint32_t nr_of_vertices;
  char *filename_local;
  
  pcStack_10 = filename;
  val = trico_read_stl((uint32_t *)((long)&vertices + 4),&stack0xffffffffffffffe0,
                       (uint32_t *)((long)&triangles + 4),(uint32_t **)&b1,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
                  ,0x29,"void transpose_uint32_aos_to_soa(const char *)");
  b2 = (uint8_t *)trico_malloc((ulong)(uint)(triangles._4_4_ * 3));
  b3 = (uint8_t *)trico_malloc((ulong)(uint)(triangles._4_4_ * 3));
  b4 = (uint8_t *)trico_malloc((ulong)(uint)(triangles._4_4_ * 3));
  triangles_from_b1b2b3b4 = (uint32_t *)trico_malloc((ulong)(uint)(triangles._4_4_ * 3));
  anon_unknown.dwarf_36f4::tic();
  trico_transpose_uint32_aos_to_soa
            (&b2,&b3,&b4,(uint8_t **)&triangles_from_b1b2b3b4,(uint32_t *)b1,triangles._4_4_ * 3);
  anon_unknown.dwarf_36f4::toc("transpose_uint32_aos_to_soa time: ");
  puStack_58 = (uint32_t *)trico_malloc((ulong)(uint)(triangles._4_4_ * 3) << 2);
  anon_unknown.dwarf_36f4::tic();
  trico_transpose_uint32_soa_to_aos
            (&stack0xffffffffffffffa8,b2,b3,b4,(uint8_t *)triangles_from_b1b2b3b4,
             triangles._4_4_ * 3);
  anon_unknown.dwarf_36f4::toc("transpose_uint32_soa_to_aos time: ");
  for (local_5c = 0; local_5c < (uint)(triangles._4_4_ * 3); local_5c = local_5c + 1) {
    TestEq<unsigned_int,unsigned_int>
              (*(uint *)(b1 + (ulong)local_5c * 4),puStack_58[local_5c],
               "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
               ,0x3e,"void transpose_uint32_aos_to_soa(const char *)");
  }
  trico_free(puStack_58);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);
  trico_free(triangles_from_b1b2b3b4);
  trico_free(pfStack_20);
  trico_free(b1);
  return;
}

Assistant:

void transpose_uint32_aos_to_soa(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);


  tic();
  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, triangles, nr_of_triangles * 3);
  toc("transpose_uint32_aos_to_soa time: ");


  uint32_t* triangles_from_b1b2b3b4 = (uint32_t*)trico_malloc(nr_of_triangles * 3 * sizeof(uint32_t));

  tic();
  trico_transpose_uint32_soa_to_aos(&triangles_from_b1b2b3b4, b1, b2, b3, b4, nr_of_triangles * 3);
  toc("transpose_uint32_soa_to_aos time: ");

  for (uint32_t i = 0; i < nr_of_triangles * 3; ++i)
    {
    TEST_EQ(triangles[i], triangles_from_b1b2b3b4[i]);
    }

  trico_free(triangles_from_b1b2b3b4);
  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);

  trico_free(vertices);
  trico_free(triangles);
  }